

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

void pbrt::parse(SceneRepresentation *scene,
                unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_> *t)

{
  char *pcVar1;
  _func_int *p_Var2;
  undefined8 uVar3;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  basic_string_view<char,_std::char_traits<char>_> __x_01;
  basic_string_view<char,_std::char_traits<char>_> __x_02;
  basic_string_view<char,_std::char_traits<char>_> __x_03;
  basic_string_view<char,_std::char_traits<char>_> __x_04;
  basic_string_view<char,_std::char_traits<char>_> __x_05;
  basic_string_view<char,_std::char_traits<char>_> __x_06;
  basic_string_view<char,_std::char_traits<char>_> __x_07;
  basic_string_view<char,_std::char_traits<char>_> __x_08;
  basic_string_view<char,_std::char_traits<char>_> __x_09;
  basic_string_view<char,_std::char_traits<char>_> __x_10;
  basic_string_view<char,_std::char_traits<char>_> __x_11;
  basic_string_view<char,_std::char_traits<char>_> __x_12;
  basic_string_view<char,_std::char_traits<char>_> __x_13;
  basic_string_view<char,_std::char_traits<char>_> __x_14;
  basic_string_view<char,_std::char_traits<char>_> __x_15;
  basic_string_view<char,_std::char_traits<char>_> __x_16;
  basic_string_view<char,_std::char_traits<char>_> __x_17;
  basic_string_view<char,_std::char_traits<char>_> __x_18;
  basic_string_view<char,_std::char_traits<char>_> __x_19;
  basic_string_view<char,_std::char_traits<char>_> __x_20;
  basic_string_view<char,_std::char_traits<char>_> __x_21;
  basic_string_view<char,_std::char_traits<char>_> __x_22;
  basic_string_view<char,_std::char_traits<char>_> __x_23;
  basic_string_view<char,_std::char_traits<char>_> __x_24;
  basic_string_view<char,_std::char_traits<char>_> __x_25;
  basic_string_view<char,_std::char_traits<char>_> __x_26;
  basic_string_view<char,_std::char_traits<char>_> __x_27;
  basic_string_view<char,_std::char_traits<char>_> __x_28;
  basic_string_view<char,_std::char_traits<char>_> __x_29;
  basic_string_view<char,_std::char_traits<char>_> __x_30;
  basic_string_view<char,_std::char_traits<char>_> __x_31;
  basic_string_view<char,_std::char_traits<char>_> __x_32;
  basic_string_view<char,_std::char_traits<char>_> __x_33;
  basic_string_view<char,_std::char_traits<char>_> __x_34;
  basic_string_view<char,_std::char_traits<char>_> __x_35;
  basic_string_view<char,_std::char_traits<char>_> __x_36;
  basic_string_view<char,_std::char_traits<char>_> __x_37;
  basic_string_view<char,_std::char_traits<char>_> __x_38;
  basic_string_view<char,_std::char_traits<char>_> __x_39;
  basic_string_view<char,_std::char_traits<char>_> __x_40;
  basic_string_view<char,_std::char_traits<char>_> __x_41;
  basic_string_view<char,_std::char_traits<char>_> __x_42;
  basic_string_view<char,_std::char_traits<char>_> __x_43;
  basic_string_view<char,_std::char_traits<char>_> __x_44;
  basic_string_view<char,_std::char_traits<char>_> __x_45;
  size_t sVar4;
  size_t sVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  bool bVar10;
  long lVar11;
  Token *pTVar12;
  FormattingScene *this;
  long lVar13;
  undefined8 extraout_RAX;
  char *pcVar14;
  size_t *psVar15;
  int i;
  ParsedParameterVector *t_00;
  offset_in_SceneRepresentation_to_subr apiFunc;
  Allocator alloc_00;
  SceneRepresentation *pSVar16;
  double dVar17;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_01;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_02;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_03;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_04;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_05;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_06;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_07;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_08;
  string_view s;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_09;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_10;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_11;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_12;
  string_view s_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_13;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_14;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_15;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_16;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_17;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_18;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_19;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_20;
  string_view s_01;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_21;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_22;
  string_view s_02;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_23;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_24;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_25;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_26;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_27;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_28;
  string_view s_03;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_29;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_30;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_31;
  string_view s_04;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_32;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_33;
  string_view s_05;
  string_view s_06;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_34;
  string_view s_07;
  string_view s_08;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_35;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_36;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_37;
  string_view s_09;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_38;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_39;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_40;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_41;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_42;
  string_view s_10;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_43;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_44;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_45;
  string_view sVar18;
  string_view sVar19;
  long lStackY_5c0;
  int in_stack_fffffffffffffa48;
  undefined4 in_stack_fffffffffffffa4c;
  bool formatting;
  SceneRepresentation *scene_local;
  CheckCallbackScope _;
  anon_class_1_0_00000001 parseError;
  optional<pbrt::Token> tok;
  Token t_1;
  bool local_510;
  string name;
  ParsedParameterVector params;
  anon_class_8_1_6da50f9a unget;
  Allocator alloc;
  _Any_data local_458;
  code *local_448;
  code *local_440;
  vector<std::unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_>,_std::allocator<std::unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_>_>_>
  fileStack;
  _Any_data local_418;
  code *local_408;
  code *local_400;
  _Any_data local_3f8;
  code *pcStack_3e8;
  code *pcStack_3e0;
  anon_class_48_6_0442aee5 basicParamListEntrypoint;
  string texName;
  string type;
  _Any_data local_360;
  code *local_350;
  code *local_348;
  TrackedMemoryResource memoryResource;
  optional<pbrt::Token> ungetToken;
  function<pstd::optional<pbrt::Token>_(int)> local_2f0;
  size_t local_2d0 [3];
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  local_2b8;
  size_t local_258 [3];
  size_t local_240 [3];
  size_t local_228 [3];
  size_t local_210 [3];
  size_t local_1f8 [3];
  size_t local_1e0 [3];
  size_t local_1c8 [3];
  size_t local_1b0 [3];
  size_t local_198 [3];
  size_t local_180 [3];
  size_t local_168 [3];
  size_t local_150 [3];
  size_t local_138 [3];
  size_t local_120 [3];
  size_t local_108 [3];
  size_t local_f0 [3];
  size_t local_d8 [3];
  size_t local_c0 [3];
  size_t local_a8 [3];
  size_t local_90 [3];
  size_t local_78 [3];
  size_t local_60 [3];
  size_t local_48 [3];
  
  scene_local = scene;
  if (scene == (SceneRepresentation *)0x0) {
    formatting = false;
  }
  else {
    lVar11 = __dynamic_cast(scene,&SceneRepresentation::typeinfo,&FormattingScene::typeinfo,0);
    formatting = lVar11 != 0;
  }
  memoryResource.source = pstd::pmr::get_default_resource();
  alloc.memoryResource = &memoryResource.super_memory_resource;
  fileStack.
  super__Vector_base<std::unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_>,_std::allocator<std::unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  memoryResource.super_memory_resource._vptr_memory_resource =
       (_func_int **)&PTR__memory_resource_02f9a9e8;
  memoryResource.allocatedBytes.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)0;
  memoryResource.maxAllocatedBytes.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)0;
  fileStack.
  super__Vector_base<std::unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_>,_std::allocator<std::unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  fileStack.
  super__Vector_base<std::unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_>,_std::allocator<std::unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::
  vector<std::unique_ptr<pbrt::Tokenizer,std::default_delete<pbrt::Tokenizer>>,std::allocator<std::unique_ptr<pbrt::Tokenizer,std::default_delete<pbrt::Tokenizer>>>>
  ::emplace_back<std::unique_ptr<pbrt::Tokenizer,std::default_delete<pbrt::Tokenizer>>>
            ((vector<std::unique_ptr<pbrt::Tokenizer,std::default_delete<pbrt::Tokenizer>>,std::allocator<std::unique_ptr<pbrt::Tokenizer,std::default_delete<pbrt::Tokenizer>>>>
              *)&fileStack,t);
  ungetToken.set = false;
  local_3f8._M_unused._M_object = (void *)0x0;
  local_3f8._8_8_ = 0;
  pcStack_3e8 = (code *)0x0;
  pcStack_3e0 = (code *)0x0;
  params._0_16_ = ZEXT816(0);
  params.field_2._0_16_ = ZEXT816(0);
  local_3f8._M_unused._M_object = operator_new(0x28);
  params.field_2._0_16_ = ZEXT816(0) << 0x40;
  *(optional<pbrt::Token> **)local_3f8._M_unused._0_8_ = &ungetToken;
  *(vector<std::unique_ptr<pbrt::Tokenizer,std::default_delete<pbrt::Tokenizer>>,std::allocator<std::unique_ptr<pbrt::Tokenizer,std::default_delete<pbrt::Tokenizer>>>>
    **)((long)local_3f8._M_unused._0_8_ + 8) =
       (vector<std::unique_ptr<pbrt::Tokenizer,std::default_delete<pbrt::Tokenizer>>,std::allocator<std::unique_ptr<pbrt::Tokenizer,std::default_delete<pbrt::Tokenizer>>>>
        *)&fileStack;
  *(_Any_data **)((long)local_3f8._M_unused._0_8_ + 0x10) = &local_3f8;
  *(bool **)((long)local_3f8._M_unused._0_8_ + 0x18) = &formatting;
  *(SceneRepresentation ***)((long)local_3f8._M_unused._0_8_ + 0x20) = &scene_local;
  local_3f8._8_8_ = params.ptr;
  pcStack_3e8 = std::
                _Function_handler<pstd::optional<pbrt::Token>_(int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/parser.cpp:550:17)>
                ::_M_manager;
  pcStack_3e0 = std::
                _Function_handler<pstd::optional<pbrt::Token>_(int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/parser.cpp:550:17)>
                ::_M_invoke;
  params._0_16_ = params.field_2._0_16_;
  std::_Function_base::~_Function_base((_Function_base *)&params);
  basicParamListEntrypoint.unget = &unget;
  basicParamListEntrypoint.alloc = &alloc;
  local_360._8_8_ = 0;
  basicParamListEntrypoint.parseError = &parseError;
  local_360._M_unused._M_object = &tok;
  tok.set = false;
  local_348 = std::
              _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/parser.cpp:609:26)>
              ::_M_invoke;
  local_350 = std::
              _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/parser.cpp:609:26)>
              ::_M_manager;
  unget.ungetToken = &ungetToken;
  basicParamListEntrypoint.nextToken = (function<pstd::optional<pbrt::Token>_(int)> *)&local_3f8;
  basicParamListEntrypoint.formatting = &formatting;
  basicParamListEntrypoint.scene = &scene_local;
  CheckCallbackScope::CheckCallbackScope
            (&_,(function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
                 *)&local_360);
  std::_Function_base::~_Function_base((_Function_base *)&local_360);
LAB_00287f52:
  std::function<pstd::optional<pbrt::Token>_(int)>::operator()
            ((optional<pbrt::Token> *)&params,
             (function<pstd::optional<pbrt::Token>_(int)> *)&local_3f8,0);
  t_00 = &params;
  pstd::optional<pbrt::Token>::operator=(&tok,(optional<pbrt::Token> *)&params);
  pstd::optional<pbrt::Token>::~optional((optional<pbrt::Token> *)&params);
  if (tok.set == false) {
    CheckCallbackScope::~CheckCallbackScope(&_);
    pstd::optional<pbrt::Token>::~optional(&tok);
    std::_Function_base::~_Function_base((_Function_base *)&local_3f8);
    pstd::optional<pbrt::Token>::~optional(&ungetToken);
    std::
    vector<std::unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_>,_std::allocator<std::unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_>_>_>
    ::~vector(&fileStack);
    pstd::pmr::memory_resource::~memory_resource(&memoryResource.super_memory_resource);
    return;
  }
  pTVar12 = pstd::optional<pbrt::Token>::value(&tok);
  switch(*(pTVar12->token)._M_str) {
  case 'A':
    pTVar12 = pstd::optional<pbrt::Token>::value(&tok);
    __x._M_len = (pTVar12->token)._M_len;
    __x._M_str = (pTVar12->token)._M_str;
    __y._M_str = "AttributeBegin";
    __y._M_len = 0xe;
    bVar10 = std::operator==(__x,__y);
    pSVar16 = scene_local;
    if (bVar10) {
      pTVar12 = pstd::optional<pbrt::Token>::value(&tok);
      lVar11 = 0xd8;
      psVar15 = local_48;
      goto LAB_00288c93;
    }
    pTVar12 = pstd::optional<pbrt::Token>::value(&tok);
    __x_21._M_len = (pTVar12->token)._M_len;
    __x_21._M_str = (pTVar12->token)._M_str;
    __y_21._M_str = "AttributeEnd";
    __y_21._M_len = 0xc;
    bVar10 = std::operator==(__x_21,__y_21);
    pSVar16 = scene_local;
    if (!bVar10) {
      pTVar12 = pstd::optional<pbrt::Token>::value(&tok);
      __x_30._M_len = (pTVar12->token)._M_len;
      __x_30._M_str = (pTVar12->token)._M_str;
      __y_30._M_str = "Attribute";
      __y_30._M_len = 9;
      bVar10 = std::operator==(__x_30,__y_30);
      if (bVar10) {
        pTVar12 = pstd::optional<pbrt::Token>::value(&tok);
        apiFunc = 0xe9;
        psVar15 = local_78;
      }
      else {
        pTVar12 = pstd::optional<pbrt::Token>::value(&tok);
        __x_35._M_len = (pTVar12->token)._M_len;
        __x_35._M_str = (pTVar12->token)._M_str;
        __y_35._M_str = "ActiveTransform";
        __y_35._M_len = 0xf;
        bVar10 = std::operator==(__x_35,__y_35);
        if (bVar10) {
          std::function<pstd::optional<pbrt::Token>_(int)>::operator()
                    ((optional<pbrt::Token> *)&params,
                     (function<pstd::optional<pbrt::Token>_(int)> *)&local_3f8,1);
          pTVar12 = pstd::optional<pbrt::Token>::value((optional<pbrt::Token> *)&params);
          t_00 = (ParsedParameterVector *)(pTVar12->token)._M_str;
          __x_45._M_len = (pTVar12->token)._M_len;
          __x_45._M_str = (pTVar12->token)._M_str;
          __x_44._M_len = (pTVar12->token)._M_len;
          __x_44._M_str = (pTVar12->token)._M_str;
          __x_36._M_len = (pTVar12->token)._M_len;
          __x_36._M_str = (pTVar12->token)._M_str;
          pstd::optional<pbrt::Token>::~optional((optional<pbrt::Token> *)&params);
          __y_36._M_str = "All";
          __y_36._M_len = 3;
          bVar10 = std::operator==(__x_36,__y_36);
          pSVar16 = scene_local;
          if (bVar10) {
            pTVar12 = pstd::optional<pbrt::Token>::value(&tok);
            psVar15 = local_90;
            lStackY_5c0 = 0x68;
          }
          else {
            __y_44._M_str = "EndTime";
            __y_44._M_len = 7;
            bVar10 = std::operator==(__x_44,__y_44);
            pSVar16 = scene_local;
            if (bVar10) {
              pTVar12 = pstd::optional<pbrt::Token>::value(&tok);
              psVar15 = local_a8;
              lStackY_5c0 = 0x70;
            }
            else {
              __y_45._M_str = "StartTime";
              __y_45._M_len = 9;
              bVar10 = std::operator==(__x_45,__y_45);
              pSVar16 = scene_local;
              if (!bVar10) goto LAB_00289905;
              pTVar12 = pstd::optional<pbrt::Token>::value(&tok);
              psVar15 = local_c0;
              lStackY_5c0 = 0x78;
            }
          }
          psVar15[2] = *(size_t *)&(pTVar12->loc).line;
          pcVar14 = (pTVar12->loc).filename._M_str;
          *psVar15 = (pTVar12->loc).filename._M_len;
          psVar15[1] = (size_t)pcVar14;
          sVar4 = (pTVar12->loc).filename._M_len;
          in_stack_fffffffffffffa48 = (int)sVar4;
          in_stack_fffffffffffffa4c = (undefined4)(sVar4 >> 0x20);
          (**(code **)((long)pSVar16->_vptr_SceneRepresentation + lStackY_5c0))(pSVar16);
          goto LAB_00287f52;
        }
        pTVar12 = pstd::optional<pbrt::Token>::value(&tok);
        __x_40._M_len = (pTVar12->token)._M_len;
        __x_40._M_str = (pTVar12->token)._M_str;
        __y_40._M_str = "AreaLightSource";
        __y_40._M_len = 0xf;
        bVar10 = std::operator==(__x_40,__y_40);
        if (!bVar10) {
          pTVar12 = pstd::optional<pbrt::Token>::value(&tok);
          t_00 = (ParsedParameterVector *)(pTVar12->token)._M_str;
          __x_43._M_len = (pTVar12->token)._M_len;
          __x_43._M_str = (pTVar12->token)._M_str;
          __y_43._M_str = "Accelerator";
          __y_43._M_len = 0xb;
          bVar10 = std::operator==(__x_43,__y_43);
          if (bVar10) {
            pTVar12 = pstd::optional<pbrt::Token>::value(&tok);
            apiFunc = 0xa1;
            psVar15 = local_f0;
            break;
          }
          goto switchD_00287faa_caseD_42;
        }
        pTVar12 = pstd::optional<pbrt::Token>::value(&tok);
        apiFunc = 0x129;
        psVar15 = local_d8;
      }
      break;
    }
    pTVar12 = pstd::optional<pbrt::Token>::value(&tok);
    lVar11 = 0xe0;
    psVar15 = local_60;
    goto LAB_00288c93;
  default:
    goto switchD_00287faa_caseD_42;
  case 'C':
    pTVar12 = pstd::optional<pbrt::Token>::value(&tok);
    __x_10._M_len = (pTVar12->token)._M_len;
    __x_10._M_str = (pTVar12->token)._M_str;
    __y_10._M_str = "ConcatTransform";
    __y_10._M_len = 0xf;
    bVar10 = std::operator==(__x_10,__y_10);
    if (bVar10) {
      std::function<pstd::optional<pbrt::Token>_(int)>::operator()
                ((optional<pbrt::Token> *)&params,
                 (function<pstd::optional<pbrt::Token>_(int)> *)&local_3f8,1);
      pTVar12 = pstd::optional<pbrt::Token>::value((optional<pbrt::Token> *)&params);
      t_00 = (ParsedParameterVector *)(pTVar12->token)._M_str;
      __x_11._M_len = (pTVar12->token)._M_len;
      __x_11._M_str = (pTVar12->token)._M_str;
      __y_11._M_str = "[";
      __y_11._M_len = 1;
      bVar10 = std::operator!=(__x_11,__y_11);
      pstd::optional<pbrt::Token>::~optional((optional<pbrt::Token> *)&params);
      if (bVar10) goto switchD_00287faa_caseD_42;
      for (lVar11 = 0; lVar11 != 0x10; lVar11 = lVar11 + 1) {
        std::function<pstd::optional<pbrt::Token>_(int)>::operator()
                  ((optional<pbrt::Token> *)&t_1,
                   (function<pstd::optional<pbrt::Token>_(int)> *)&local_3f8,1);
        pTVar12 = pstd::optional<pbrt::Token>::value((optional<pbrt::Token> *)&t_1);
        dVar17 = parseNumber(pTVar12);
        *(float *)((long)&params.alloc.memoryResource + lVar11 * 4) = (float)dVar17;
        pstd::optional<pbrt::Token>::~optional((optional<pbrt::Token> *)&t_1);
      }
      std::function<pstd::optional<pbrt::Token>_(int)>::operator()
                ((optional<pbrt::Token> *)&t_1,
                 (function<pstd::optional<pbrt::Token>_(int)> *)&local_3f8,1);
      pTVar12 = pstd::optional<pbrt::Token>::value((optional<pbrt::Token> *)&t_1);
      t_00 = (ParsedParameterVector *)(pTVar12->token)._M_str;
      __x_23._M_len = (pTVar12->token)._M_len;
      __x_23._M_str = (pTVar12->token)._M_str;
      __y_23._M_str = "]";
      __y_23._M_len = 1;
      bVar10 = std::operator!=(__x_23,__y_23);
      pstd::optional<pbrt::Token>::~optional((optional<pbrt::Token> *)&t_1);
      pSVar16 = scene_local;
      if (bVar10) goto LAB_002898e1;
      pTVar12 = pstd::optional<pbrt::Token>::value(&tok);
      sVar19 = (pTVar12->loc).filename;
      in_stack_fffffffffffffa48 = (int)sVar19._M_len;
      in_stack_fffffffffffffa4c = sVar19._M_len._4_4_;
      (*pSVar16->_vptr_SceneRepresentation[9])(pSVar16,&params);
      goto LAB_00287f52;
    }
    pTVar12 = pstd::optional<pbrt::Token>::value(&tok);
    __x_22._M_len = (pTVar12->token)._M_len;
    __x_22._M_str = (pTVar12->token)._M_str;
    __y_22._M_str = "CoordinateSystem";
    __y_22._M_len = 0x10;
    pcVar14 = "CoordinateSystem";
    bVar10 = std::operator==(__x_22,__y_22);
    if (bVar10) {
      std::function<pstd::optional<pbrt::Token>_(int)>::operator()
                ((optional<pbrt::Token> *)&params,
                 (function<pstd::optional<pbrt::Token>_(int)> *)&local_3f8,1);
      pTVar12 = pstd::optional<pbrt::Token>::value((optional<pbrt::Token> *)&params);
      sVar19 = dequoteString(pTVar12);
      s_02._M_len = sVar19._M_str;
      pstd::optional<pbrt::Token>::~optional((optional<pbrt::Token> *)&params);
      pSVar16 = scene_local;
      s_02._M_str = pcVar14;
      toString_abi_cxx11_((string *)&params,(pbrt *)sVar19._M_len,s_02);
      pTVar12 = pstd::optional<pbrt::Token>::value(&tok);
      sVar4 = (pTVar12->loc).filename._M_len;
      in_stack_fffffffffffffa48 = (int)sVar4;
      in_stack_fffffffffffffa4c = (undefined4)(sVar4 >> 0x20);
      (*pSVar16->_vptr_SceneRepresentation[0xb])(pSVar16,&params);
    }
    else {
      pTVar12 = pstd::optional<pbrt::Token>::value(&tok);
      __x_31._M_len = (pTVar12->token)._M_len;
      __x_31._M_str = (pTVar12->token)._M_str;
      __y_31._M_str = "CoordSysTransform";
      __y_31._M_len = 0x11;
      pcVar14 = "CoordSysTransform";
      bVar10 = std::operator==(__x_31,__y_31);
      if (!bVar10) {
        pTVar12 = pstd::optional<pbrt::Token>::value(&tok);
        __x_37._M_len = (pTVar12->token)._M_len;
        __x_37._M_str = (pTVar12->token)._M_str;
        __y_37._M_str = "ColorSpace";
        __y_37._M_len = 10;
        pcVar14 = "ColorSpace";
        bVar10 = std::operator==(__x_37,__y_37);
        if (bVar10) {
          std::function<pstd::optional<pbrt::Token>_(int)>::operator()
                    ((optional<pbrt::Token> *)&params,
                     (function<pstd::optional<pbrt::Token>_(int)> *)&local_3f8,1);
          pTVar12 = pstd::optional<pbrt::Token>::value((optional<pbrt::Token> *)&params);
          sVar19 = dequoteString(pTVar12);
          s_09._M_len = sVar19._M_str;
          pstd::optional<pbrt::Token>::~optional((optional<pbrt::Token> *)&params);
          pSVar16 = scene_local;
          s_09._M_str = pcVar14;
          toString_abi_cxx11_((string *)&params,(pbrt *)sVar19._M_len,s_09);
          pTVar12 = pstd::optional<pbrt::Token>::value(&tok);
          sVar4 = (pTVar12->loc).filename._M_len;
          in_stack_fffffffffffffa48 = (int)sVar4;
          in_stack_fffffffffffffa4c = (undefined4)(sVar4 >> 0x20);
          (*pSVar16->_vptr_SceneRepresentation[0x11])(pSVar16,&params);
          goto LAB_0028844a;
        }
        pTVar12 = pstd::optional<pbrt::Token>::value(&tok);
        t_00 = (ParsedParameterVector *)(pTVar12->token)._M_str;
        __x_41._M_len = (pTVar12->token)._M_len;
        __x_41._M_str = (pTVar12->token)._M_str;
        __y_41._M_str = "Camera";
        __y_41._M_len = 6;
        bVar10 = std::operator==(__x_41,__y_41);
        if (bVar10) {
          pTVar12 = pstd::optional<pbrt::Token>::value(&tok);
          apiFunc = 0xb1;
          psVar15 = local_108;
          break;
        }
        goto switchD_00287faa_caseD_42;
      }
      std::function<pstd::optional<pbrt::Token>_(int)>::operator()
                ((optional<pbrt::Token> *)&params,
                 (function<pstd::optional<pbrt::Token>_(int)> *)&local_3f8,1);
      pTVar12 = pstd::optional<pbrt::Token>::value((optional<pbrt::Token> *)&params);
      sVar19 = dequoteString(pTVar12);
      s_04._M_len = sVar19._M_str;
      pstd::optional<pbrt::Token>::~optional((optional<pbrt::Token> *)&params);
      pSVar16 = scene_local;
      s_04._M_str = pcVar14;
      toString_abi_cxx11_((string *)&params,(pbrt *)sVar19._M_len,s_04);
      pTVar12 = pstd::optional<pbrt::Token>::value(&tok);
      sVar4 = (pTVar12->loc).filename._M_len;
      in_stack_fffffffffffffa48 = (int)sVar4;
      in_stack_fffffffffffffa4c = (undefined4)(sVar4 >> 0x20);
      (*pSVar16->_vptr_SceneRepresentation[0xc])(pSVar16,&params);
    }
    goto LAB_0028844a;
  case 'F':
    pTVar12 = pstd::optional<pbrt::Token>::value(&tok);
    t_00 = (ParsedParameterVector *)(pTVar12->token)._M_str;
    __x_07._M_len = (pTVar12->token)._M_len;
    __x_07._M_str = (pTVar12->token)._M_str;
    __y_07._M_str = "Film";
    __y_07._M_len = 4;
    bVar10 = std::operator==(__x_07,__y_07);
    if (!bVar10) goto switchD_00287faa_caseD_42;
    pTVar12 = pstd::optional<pbrt::Token>::value(&tok);
    apiFunc = 0x99;
    psVar15 = local_120;
    break;
  case 'I':
    pTVar12 = pstd::optional<pbrt::Token>::value(&tok);
    __x_09._M_len = (pTVar12->token)._M_len;
    __x_09._M_str = (pTVar12->token)._M_str;
    __y_09._M_str = "Integrator";
    __y_09._M_len = 10;
    bVar10 = std::operator==(__x_09,__y_09);
    if (bVar10) {
      pTVar12 = pstd::optional<pbrt::Token>::value(&tok);
      apiFunc = 0xa9;
      psVar15 = local_138;
      break;
    }
    pTVar12 = pstd::optional<pbrt::Token>::value(&tok);
    __x_20._M_len = (pTVar12->token)._M_len;
    __x_20._M_str = (pTVar12->token)._M_str;
    __y_20._M_str = "Include";
    __y_20._M_len = 7;
    bVar10 = std::operator==(__x_20,__y_20);
    if (bVar10) {
      std::function<pstd::optional<pbrt::Token>_(int)>::operator()
                ((optional<pbrt::Token> *)&params,
                 (function<pstd::optional<pbrt::Token>_(int)> *)&local_3f8,1);
      pTVar12 = pstd::optional<pbrt::Token>::value((optional<pbrt::Token> *)&params);
      pcVar14 = *(char **)&(pTVar12->loc).line;
      t_1.token._M_len = (pTVar12->token)._M_len;
      t_1.token._M_str = (pTVar12->token)._M_str;
      t_1.loc.filename._M_len = (pTVar12->loc).filename._M_len;
      t_1.loc.filename._M_str = (pTVar12->loc).filename._M_str;
      t_1.loc._16_8_ = pcVar14;
      pstd::optional<pbrt::Token>::~optional((optional<pbrt::Token> *)&params);
      sVar19 = dequoteString(&t_1);
      s_01._M_len = sVar19._M_str;
      s_01._M_str = pcVar14;
      toString_abi_cxx11_((string *)&params,(pbrt *)sVar19._M_len,s_01);
      if (formatting == true) {
        this = (FormattingScene *)
               __dynamic_cast(scene_local,&SceneRepresentation::typeinfo,&FormattingScene::typeinfo,
                              0);
        FormattingScene::indent_abi_cxx11_(&name,this,0);
        Printf<std::__cxx11::string,std::__cxx11::string&>
                  ("%sInclude \"%s\"\n",&name,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&params);
        std::__cxx11::string::~string((string *)&name);
      }
      else {
        ResolveFilename(&name,(string *)&params);
        std::__cxx11::string::operator=((string *)&params,(string *)&name);
        std::__cxx11::string::~string((string *)&name);
        local_418._M_unused._M_object = (void *)0x0;
        local_418._8_8_ = 0;
        local_400 = std::
                    _Function_handler<void_(const_char_*,_const_pbrt::FileLoc_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/parser.cpp:542:23)>
                    ::_M_invoke;
        local_408 = std::
                    _Function_handler<void_(const_char_*,_const_pbrt::FileLoc_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/parser.cpp:542:23)>
                    ::_M_manager;
        Tokenizer::CreateFromFile
                  ((Tokenizer *)&name,(string *)&params,
                   (function<void_(const_char_*,_const_pbrt::FileLoc_*)> *)&local_418);
        std::_Function_base::~_Function_base((_Function_base *)&local_418);
        if (name._M_dataplus._M_p != (pointer)0x0) {
          std::
          vector<std::unique_ptr<pbrt::Tokenizer,std::default_delete<pbrt::Tokenizer>>,std::allocator<std::unique_ptr<pbrt::Tokenizer,std::default_delete<pbrt::Tokenizer>>>>
          ::emplace_back<std::unique_ptr<pbrt::Tokenizer,std::default_delete<pbrt::Tokenizer>>>
                    ((vector<std::unique_ptr<pbrt::Tokenizer,std::default_delete<pbrt::Tokenizer>>,std::allocator<std::unique_ptr<pbrt::Tokenizer,std::default_delete<pbrt::Tokenizer>>>>
                      *)&fileStack,
                     (unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_> *)&name);
        }
        std::unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_>::~unique_ptr
                  ((unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_> *)&name);
      }
      goto LAB_0028844a;
    }
    pTVar12 = pstd::optional<pbrt::Token>::value(&tok);
    t_00 = (ParsedParameterVector *)(pTVar12->token)._M_str;
    __x_29._M_len = (pTVar12->token)._M_len;
    __x_29._M_str = (pTVar12->token)._M_str;
    __y_29._M_str = "Identity";
    __y_29._M_len = 8;
    bVar10 = std::operator==(__x_29,__y_29);
    pSVar16 = scene_local;
    if (bVar10) {
      pTVar12 = pstd::optional<pbrt::Token>::value(&tok);
      psVar15 = local_150;
      lVar11 = 0x28;
      goto LAB_00288c93;
    }
    goto switchD_00287faa_caseD_42;
  case 'L':
    pTVar12 = pstd::optional<pbrt::Token>::value(&tok);
    __x_05._M_len = (pTVar12->token)._M_len;
    __x_05._M_str = (pTVar12->token)._M_str;
    __y_05._M_str = "LightSource";
    __y_05._M_len = 0xb;
    bVar10 = std::operator==(__x_05,__y_05);
    if (!bVar10) {
      pTVar12 = pstd::optional<pbrt::Token>::value(&tok);
      t_00 = (ParsedParameterVector *)(pTVar12->token)._M_str;
      __x_17._M_len = (pTVar12->token)._M_len;
      __x_17._M_str = (pTVar12->token)._M_str;
      __y_17._M_str = "LookAt";
      __y_17._M_len = 6;
      bVar10 = std::operator==(__x_17,__y_17);
      if (!bVar10) goto switchD_00287faa_caseD_42;
      for (lVar11 = 0; pcVar1 = t_1.loc.filename._M_str, sVar5 = t_1.loc.filename._M_len,
          pcVar14 = t_1.token._M_str, sVar4 = t_1.token._M_len, pSVar16 = scene_local, lVar11 != 9;
          lVar11 = lVar11 + 1) {
        std::function<pstd::optional<pbrt::Token>_(int)>::operator()
                  ((optional<pbrt::Token> *)&params,
                   (function<pstd::optional<pbrt::Token>_(int)> *)&local_3f8,1);
        pTVar12 = pstd::optional<pbrt::Token>::value((optional<pbrt::Token> *)&params);
        dVar17 = parseNumber(pTVar12);
        *(float *)((long)&t_1.token._M_len + lVar11 * 4) = (float)dVar17;
        pstd::optional<pbrt::Token>::~optional((optional<pbrt::Token> *)&params);
      }
      uVar6 = t_1.token._M_len >> 0x20;
      uVar7 = (ulong)t_1.token._M_str >> 0x20;
      uVar8 = t_1.loc.filename._M_len >> 0x20;
      uVar9 = (ulong)t_1.loc.filename._M_str >> 0x20;
      in_stack_fffffffffffffa48 = t_1.loc.line;
      pstd::optional<pbrt::Token>::value(&tok);
      (*pSVar16->_vptr_SceneRepresentation[8])
                (sVar4 & 0xffffffff,uVar6,(ulong)pcVar14 & 0xffffffff,uVar7,sVar5 & 0xffffffff,uVar8
                 ,(ulong)pcVar1 & 0xffffffff,uVar9,pSVar16);
      goto LAB_00287f52;
    }
    pTVar12 = pstd::optional<pbrt::Token>::value(&tok);
    apiFunc = 0x121;
    psVar15 = local_168;
    break;
  case 'M':
    pTVar12 = pstd::optional<pbrt::Token>::value(&tok);
    __x_06._M_len = (pTVar12->token)._M_len;
    __x_06._M_str = (pTVar12->token)._M_str;
    __y_06._M_str = "MakeNamedMaterial";
    __y_06._M_len = 0x11;
    bVar10 = std::operator==(__x_06,__y_06);
    if (bVar10) {
      pTVar12 = pstd::optional<pbrt::Token>::value(&tok);
      apiFunc = 0x111;
      psVar15 = local_180;
    }
    else {
      pTVar12 = pstd::optional<pbrt::Token>::value(&tok);
      __x_18._M_len = (pTVar12->token)._M_len;
      __x_18._M_str = (pTVar12->token)._M_str;
      __y_18._M_str = "MakeNamedMedium";
      __y_18._M_len = 0xf;
      bVar10 = std::operator==(__x_18,__y_18);
      if (bVar10) {
        pTVar12 = pstd::optional<pbrt::Token>::value(&tok);
        apiFunc = 0xb9;
        psVar15 = local_198;
      }
      else {
        pTVar12 = pstd::optional<pbrt::Token>::value(&tok);
        __x_27._M_len = (pTVar12->token)._M_len;
        __x_27._M_str = (pTVar12->token)._M_str;
        __y_27._M_str = "Material";
        __y_27._M_len = 8;
        bVar10 = std::operator==(__x_27,__y_27);
        if (!bVar10) {
          pTVar12 = pstd::optional<pbrt::Token>::value(&tok);
          t_00 = (ParsedParameterVector *)(pTVar12->token)._M_str;
          __x_33._M_len = (pTVar12->token)._M_len;
          __x_33._M_str = (pTVar12->token)._M_str;
          __y_33._M_str = "MediumInterface";
          __y_33._M_len = 0xf;
          bVar10 = std::operator==(__x_33,__y_33);
          if (!bVar10) {
switchD_00287faa_caseD_42:
            pTVar12 = pstd::optional<pbrt::Token>::value(&tok);
            parse::anon_class_1_0_00000001::operator()
                      ((anon_class_1_0_00000001 *)pTVar12,(Token *)t_00);
LAB_002898e1:
            pTVar12 = pstd::optional<pbrt::Token>::value(&tok);
            parse::anon_class_1_0_00000001::operator()
                      ((anon_class_1_0_00000001 *)pTVar12,(Token *)t_00);
LAB_002898f3:
            pTVar12 = pstd::optional<pbrt::Token>::value(&tok);
            parse::anon_class_1_0_00000001::operator()
                      ((anon_class_1_0_00000001 *)pTVar12,(Token *)t_00);
LAB_00289905:
            pTVar12 = pstd::optional<pbrt::Token>::value(&tok);
            parse::anon_class_1_0_00000001::operator()
                      ((anon_class_1_0_00000001 *)pTVar12,(Token *)t_00);
            CheckCallbackScope::~CheckCallbackScope(&_);
            pstd::optional<pbrt::Token>::~optional(&tok);
            std::_Function_base::~_Function_base((_Function_base *)&local_3f8);
            pstd::optional<pbrt::Token>::~optional(&ungetToken);
            std::
            vector<std::unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_>,_std::allocator<std::unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_>_>_>
            ::~vector(&fileStack);
            pstd::pmr::memory_resource::~memory_resource(&memoryResource.super_memory_resource);
            _Unwind_Resume(extraout_RAX);
          }
          std::function<pstd::optional<pbrt::Token>_(int)>::operator()
                    ((optional<pbrt::Token> *)&params,
                     (function<pstd::optional<pbrt::Token>_(int)> *)&local_3f8,1);
          pTVar12 = pstd::optional<pbrt::Token>::value((optional<pbrt::Token> *)&params);
          sVar19 = dequoteString(pTVar12);
          s_05._M_len = sVar19._M_str;
          pstd::optional<pbrt::Token>::~optional((optional<pbrt::Token> *)&params);
          lVar11 = 0x10;
          do {
            pcVar14 = (char *)((long)&params.alloc.memoryResource + lVar11);
            lVar13 = lVar11 + 0x20;
            *(char **)((long)&name.field_2 + lVar11) = pcVar14;
            *(undefined8 *)((long)&name.field_2 + lVar11 + 8) = 0;
            *pcVar14 = '\0';
            lVar11 = lVar13;
          } while (lVar13 != 0x50);
          s_05._M_str = pcVar14;
          toString_abi_cxx11_((string *)&t_1,(pbrt *)sVar19._M_len,s_05);
          std::__cxx11::string::operator=((string *)&params,(string *)&t_1);
          std::__cxx11::string::~string((string *)&t_1);
          std::function<pstd::optional<pbrt::Token>_(int)>::operator()
                    ((optional<pbrt::Token> *)&t_1,
                     (function<pstd::optional<pbrt::Token>_(int)> *)&local_3f8,0);
          if (local_510 == true) {
            pTVar12 = pstd::optional<pbrt::Token>::value((optional<pbrt::Token> *)&t_1);
            pcVar14 = (char *)(pTVar12->token)._M_len;
            if (((pcVar14 < (char *)0x2) || (pcVar1 = (pTVar12->token)._M_str, *pcVar1 != '\"')) ||
               ((pcVar1 + -1)[(long)pcVar14] != '\"')) {
              pTVar12 = pstd::optional<pbrt::Token>::value((optional<pbrt::Token> *)&t_1);
              parse::anon_class_8_1_6da50f9a::operator()(&unget,*pTVar12);
              goto LAB_00289469;
            }
            pTVar12 = pstd::optional<pbrt::Token>::value((optional<pbrt::Token> *)&t_1);
            sVar19 = dequoteString(pTVar12);
            s_06._M_len = sVar19._M_str;
            s_06._M_str = pcVar14;
            toString_abi_cxx11_(&name,(pbrt *)sVar19._M_len,s_06);
            std::__cxx11::string::operator=
                      ((string *)((long)&params.field_2 + 0x10),(string *)&name);
            std::__cxx11::string::~string((string *)&name);
          }
          else {
LAB_00289469:
            std::__cxx11::string::_M_assign((string *)((long)&params.field_2 + 0x10));
          }
          pSVar16 = scene_local;
          pTVar12 = pstd::optional<pbrt::Token>::value(&tok);
          sVar4 = (pTVar12->loc).filename._M_len;
          in_stack_fffffffffffffa48 = (int)sVar4;
          in_stack_fffffffffffffa4c = (undefined4)(sVar4 >> 0x20);
          (*pSVar16->_vptr_SceneRepresentation[0x18])
                    (pSVar16,&params,(undefined1 *)((long)&params.field_2 + 0x10));
          pstd::optional<pbrt::Token>::~optional((optional<pbrt::Token> *)&t_1);
          lVar11 = 0x20;
          do {
            std::__cxx11::string::~string((string *)((long)&params.alloc.memoryResource + lVar11));
            lVar11 = lVar11 + -0x20;
          } while (lVar11 != -0x20);
          goto LAB_00287f52;
        }
        pTVar12 = pstd::optional<pbrt::Token>::value(&tok);
        apiFunc = 0x109;
        psVar15 = local_1b0;
      }
    }
    break;
  case 'N':
    pTVar12 = pstd::optional<pbrt::Token>::value(&tok);
    t_00 = (ParsedParameterVector *)(pTVar12->token)._M_str;
    __x_12._M_len = (pTVar12->token)._M_len;
    __x_12._M_str = (pTVar12->token)._M_str;
    __y_12._M_str = "NamedMaterial";
    __y_12._M_len = 0xd;
    pcVar14 = "NamedMaterial";
    bVar10 = std::operator==(__x_12,__y_12);
    if (bVar10) {
      std::function<pstd::optional<pbrt::Token>_(int)>::operator()
                ((optional<pbrt::Token> *)&params,
                 (function<pstd::optional<pbrt::Token>_(int)> *)&local_3f8,1);
      pTVar12 = pstd::optional<pbrt::Token>::value((optional<pbrt::Token> *)&params);
      sVar19 = dequoteString(pTVar12);
      s_00._M_len = sVar19._M_str;
      pstd::optional<pbrt::Token>::~optional((optional<pbrt::Token> *)&params);
      pSVar16 = scene_local;
      s_00._M_str = pcVar14;
      toString_abi_cxx11_((string *)&params,(pbrt *)sVar19._M_len,s_00);
      pTVar12 = pstd::optional<pbrt::Token>::value(&tok);
      sVar4 = (pTVar12->loc).filename._M_len;
      in_stack_fffffffffffffa48 = (int)sVar4;
      in_stack_fffffffffffffa4c = (undefined4)(sVar4 >> 0x20);
      (*pSVar16->_vptr_SceneRepresentation[0x23])(pSVar16,&params);
      goto LAB_0028844a;
    }
    goto switchD_00287faa_caseD_42;
  case 'O':
    pTVar12 = pstd::optional<pbrt::Token>::value(&tok);
    __x_08._M_len = (pTVar12->token)._M_len;
    __x_08._M_str = (pTVar12->token)._M_str;
    __y_08._M_str = "ObjectBegin";
    __y_08._M_len = 0xb;
    pcVar14 = "ObjectBegin";
    bVar10 = std::operator==(__x_08,__y_08);
    if (bVar10) {
      std::function<pstd::optional<pbrt::Token>_(int)>::operator()
                ((optional<pbrt::Token> *)&params,
                 (function<pstd::optional<pbrt::Token>_(int)> *)&local_3f8,1);
      pTVar12 = pstd::optional<pbrt::Token>::value((optional<pbrt::Token> *)&params);
      sVar19 = dequoteString(pTVar12);
      s._M_len = sVar19._M_str;
      pstd::optional<pbrt::Token>::~optional((optional<pbrt::Token> *)&params);
      pSVar16 = scene_local;
      s._M_str = pcVar14;
      toString_abi_cxx11_((string *)&params,(pbrt *)sVar19._M_len,s);
      pTVar12 = pstd::optional<pbrt::Token>::value(&tok);
      sVar4 = (pTVar12->loc).filename._M_len;
      in_stack_fffffffffffffa48 = (int)sVar4;
      in_stack_fffffffffffffa4c = (undefined4)(sVar4 >> 0x20);
      (*pSVar16->_vptr_SceneRepresentation[0x27])(pSVar16,&params);
    }
    else {
      pTVar12 = pstd::optional<pbrt::Token>::value(&tok);
      __x_19._M_len = (pTVar12->token)._M_len;
      __x_19._M_str = (pTVar12->token)._M_str;
      __y_19._M_str = "ObjectEnd";
      __y_19._M_len = 9;
      bVar10 = std::operator==(__x_19,__y_19);
      pSVar16 = scene_local;
      if (bVar10) {
        pTVar12 = pstd::optional<pbrt::Token>::value(&tok);
        lVar11 = 0x140;
        psVar15 = local_1c8;
        goto LAB_00288c93;
      }
      pTVar12 = pstd::optional<pbrt::Token>::value(&tok);
      __x_28._M_len = (pTVar12->token)._M_len;
      __x_28._M_str = (pTVar12->token)._M_str;
      __y_28._M_str = "ObjectInstance";
      __y_28._M_len = 0xe;
      pcVar14 = "ObjectInstance";
      bVar10 = std::operator==(__x_28,__y_28);
      if (!bVar10) {
        pTVar12 = pstd::optional<pbrt::Token>::value(&tok);
        t_00 = (ParsedParameterVector *)(pTVar12->token)._M_str;
        __x_34._M_len = (pTVar12->token)._M_len;
        __x_34._M_str = (pTVar12->token)._M_str;
        __y_34._M_str = "Option";
        __y_34._M_len = 6;
        pcVar14 = "Option";
        bVar10 = std::operator==(__x_34,__y_34);
        if (!bVar10) goto switchD_00287faa_caseD_42;
        std::function<pstd::optional<pbrt::Token>_(int)>::operator()
                  ((optional<pbrt::Token> *)&params,
                   (function<pstd::optional<pbrt::Token>_(int)> *)&local_3f8,1);
        pTVar12 = pstd::optional<pbrt::Token>::value((optional<pbrt::Token> *)&params);
        sVar19 = dequoteString(pTVar12);
        s_07._M_len = sVar19._M_str;
        s_07._M_str = pcVar14;
        toString_abi_cxx11_((string *)&t_1,(pbrt *)sVar19._M_len,s_07);
        pstd::optional<pbrt::Token>::~optional((optional<pbrt::Token> *)&params);
        std::function<pstd::optional<pbrt::Token>_(int)>::operator()
                  ((optional<pbrt::Token> *)&params,
                   (function<pstd::optional<pbrt::Token>_(int)> *)&local_3f8,1);
        pTVar12 = pstd::optional<pbrt::Token>::value((optional<pbrt::Token> *)&params);
        s_08._M_str = pcVar14;
        s_08._M_len = (size_t)(pTVar12->token)._M_str;
        toString_abi_cxx11_(&name,(pbrt *)(pTVar12->token)._M_len,s_08);
        pstd::optional<pbrt::Token>::~optional((optional<pbrt::Token> *)&params);
        pSVar16 = scene_local;
        pTVar12 = pstd::optional<pbrt::Token>::value(&tok);
        sVar4 = (pTVar12->loc).filename._M_len;
        in_stack_fffffffffffffa48 = (int)sVar4;
        in_stack_fffffffffffffa4c = (undefined4)(sVar4 >> 0x20);
        (*pSVar16->_vptr_SceneRepresentation[4])(pSVar16,&t_1,&name);
        std::__cxx11::string::~string((string *)&name);
        std::__cxx11::string::~string((string *)&t_1);
        goto LAB_00287f52;
      }
      std::function<pstd::optional<pbrt::Token>_(int)>::operator()
                ((optional<pbrt::Token> *)&params,
                 (function<pstd::optional<pbrt::Token>_(int)> *)&local_3f8,1);
      pTVar12 = pstd::optional<pbrt::Token>::value((optional<pbrt::Token> *)&params);
      sVar19 = dequoteString(pTVar12);
      s_03._M_len = sVar19._M_str;
      pstd::optional<pbrt::Token>::~optional((optional<pbrt::Token> *)&params);
      pSVar16 = scene_local;
      s_03._M_str = pcVar14;
      toString_abi_cxx11_((string *)&params,(pbrt *)sVar19._M_len,s_03);
      pTVar12 = pstd::optional<pbrt::Token>::value(&tok);
      sVar4 = (pTVar12->loc).filename._M_len;
      in_stack_fffffffffffffa48 = (int)sVar4;
      in_stack_fffffffffffffa4c = (undefined4)(sVar4 >> 0x20);
      (*pSVar16->_vptr_SceneRepresentation[0x29])(pSVar16,&params);
    }
LAB_0028844a:
    std::__cxx11::string::~string((string *)&params);
    goto LAB_00287f52;
  case 'P':
    pTVar12 = pstd::optional<pbrt::Token>::value(&tok);
    t_00 = (ParsedParameterVector *)(pTVar12->token)._M_str;
    __x_04._M_len = (pTVar12->token)._M_len;
    __x_04._M_str = (pTVar12->token)._M_str;
    __y_04._M_str = "PixelFilter";
    __y_04._M_len = 0xb;
    bVar10 = std::operator==(__x_04,__y_04);
    if (!bVar10) goto switchD_00287faa_caseD_42;
    pTVar12 = pstd::optional<pbrt::Token>::value(&tok);
    apiFunc = 0x91;
    psVar15 = local_1e0;
    break;
  case 'R':
    pTVar12 = pstd::optional<pbrt::Token>::value(&tok);
    __x_01._M_len = (pTVar12->token)._M_len;
    __x_01._M_str = (pTVar12->token)._M_str;
    __y_01._M_str = "ReverseOrientation";
    __y_01._M_len = 0x12;
    bVar10 = std::operator==(__x_01,__y_01);
    pSVar16 = scene_local;
    if (bVar10) {
      pTVar12 = pstd::optional<pbrt::Token>::value(&tok);
      lVar11 = 0x130;
      psVar15 = local_1f8;
      goto LAB_00288c93;
    }
    pTVar12 = pstd::optional<pbrt::Token>::value(&tok);
    t_00 = (ParsedParameterVector *)(pTVar12->token)._M_str;
    __x_14._M_len = (pTVar12->token)._M_len;
    __x_14._M_str = (pTVar12->token)._M_str;
    __y_14._M_str = "Rotate";
    __y_14._M_len = 6;
    bVar10 = std::operator==(__x_14,__y_14);
    if (!bVar10) goto switchD_00287faa_caseD_42;
    for (lVar11 = 0; pcVar14 = t_1.token._M_str, sVar4 = t_1.token._M_len, pSVar16 = scene_local,
        lVar11 != 4; lVar11 = lVar11 + 1) {
      std::function<pstd::optional<pbrt::Token>_(int)>::operator()
                ((optional<pbrt::Token> *)&params,
                 (function<pstd::optional<pbrt::Token>_(int)> *)&local_3f8,1);
      pTVar12 = pstd::optional<pbrt::Token>::value((optional<pbrt::Token> *)&params);
      dVar17 = parseNumber(pTVar12);
      *(float *)((long)&t_1.token._M_len + lVar11 * 4) = (float)dVar17;
      pstd::optional<pbrt::Token>::~optional((optional<pbrt::Token> *)&params);
    }
    uVar6 = t_1.token._M_len >> 0x20;
    uVar7 = (ulong)t_1.token._M_str >> 0x20;
    pTVar12 = pstd::optional<pbrt::Token>::value(&tok);
    sVar5 = (pTVar12->loc).filename._M_len;
    in_stack_fffffffffffffa48 = (int)sVar5;
    in_stack_fffffffffffffa4c = (undefined4)(sVar5 >> 0x20);
    (*pSVar16->_vptr_SceneRepresentation[7])
              (sVar4 & 0xffffffff,uVar6,(ulong)pcVar14 & 0xffffffff,uVar7,pSVar16);
    goto LAB_00287f52;
  case 'S':
    pTVar12 = pstd::optional<pbrt::Token>::value(&tok);
    __x_03._M_len = (pTVar12->token)._M_len;
    __x_03._M_str = (pTVar12->token)._M_str;
    __y_03._M_str = "Shape";
    __y_03._M_len = 5;
    bVar10 = std::operator==(__x_03,__y_03);
    if (bVar10) {
      pTVar12 = pstd::optional<pbrt::Token>::value(&tok);
      psVar15 = local_210;
      apiFunc = 9;
    }
    else {
      pTVar12 = pstd::optional<pbrt::Token>::value(&tok);
      __x_16._M_len = (pTVar12->token)._M_len;
      __x_16._M_str = (pTVar12->token)._M_str;
      __y_16._M_str = "Sampler";
      __y_16._M_len = 7;
      bVar10 = std::operator==(__x_16,__y_16);
      if (!bVar10) {
        pTVar12 = pstd::optional<pbrt::Token>::value(&tok);
        t_00 = (ParsedParameterVector *)(pTVar12->token)._M_str;
        __x_26._M_len = (pTVar12->token)._M_len;
        __x_26._M_str = (pTVar12->token)._M_str;
        __y_26._M_str = "Scale";
        __y_26._M_len = 5;
        bVar10 = std::operator==(__x_26,__y_26);
        if (!bVar10) goto switchD_00287faa_caseD_42;
        for (lVar11 = 0; pcVar14 = t_1.token._M_str, sVar4 = t_1.token._M_len, pSVar16 = scene_local
            , lVar11 != 3; lVar11 = lVar11 + 1) {
          std::function<pstd::optional<pbrt::Token>_(int)>::operator()
                    ((optional<pbrt::Token> *)&params,
                     (function<pstd::optional<pbrt::Token>_(int)> *)&local_3f8,1);
          pTVar12 = pstd::optional<pbrt::Token>::value((optional<pbrt::Token> *)&params);
          dVar17 = parseNumber(pTVar12);
          *(float *)((long)&t_1.token._M_len + lVar11 * 4) = (float)dVar17;
          pstd::optional<pbrt::Token>::~optional((optional<pbrt::Token> *)&params);
        }
        uVar6 = t_1.token._M_len >> 0x20;
        pTVar12 = pstd::optional<pbrt::Token>::value(&tok);
        sVar5 = (pTVar12->loc).filename._M_len;
        in_stack_fffffffffffffa48 = (int)sVar5;
        in_stack_fffffffffffffa4c = (undefined4)(sVar5 >> 0x20);
        (**pSVar16->_vptr_SceneRepresentation)
                  (sVar4 & 0xffffffff,uVar6,(ulong)pcVar14 & 0xffffffff,pSVar16);
        goto LAB_00287f52;
      }
      pTVar12 = pstd::optional<pbrt::Token>::value(&tok);
      apiFunc = 0xc9;
      psVar15 = local_228;
    }
    break;
  case 'T':
    pTVar12 = pstd::optional<pbrt::Token>::value(&tok);
    __x_00._M_len = (pTVar12->token)._M_len;
    __x_00._M_str = (pTVar12->token)._M_str;
    __y_00._M_str = "TransformBegin";
    __y_00._M_len = 0xe;
    bVar10 = std::operator==(__x_00,__y_00);
    pSVar16 = scene_local;
    if (bVar10) {
      pTVar12 = pstd::optional<pbrt::Token>::value(&tok);
      lVar11 = 0xf0;
      psVar15 = local_240;
    }
    else {
      pTVar12 = pstd::optional<pbrt::Token>::value(&tok);
      __x_13._M_len = (pTVar12->token)._M_len;
      __x_13._M_str = (pTVar12->token)._M_str;
      __y_13._M_str = "TransformEnd";
      __y_13._M_len = 0xc;
      bVar10 = std::operator==(__x_13,__y_13);
      pSVar16 = scene_local;
      if (!bVar10) {
        pTVar12 = pstd::optional<pbrt::Token>::value(&tok);
        __x_24._M_len = (pTVar12->token)._M_len;
        __x_24._M_str = (pTVar12->token)._M_str;
        __y_24._M_str = "Transform";
        __y_24._M_len = 9;
        bVar10 = std::operator==(__x_24,__y_24);
        if (bVar10) {
          std::function<pstd::optional<pbrt::Token>_(int)>::operator()
                    ((optional<pbrt::Token> *)&params,
                     (function<pstd::optional<pbrt::Token>_(int)> *)&local_3f8,1);
          pTVar12 = pstd::optional<pbrt::Token>::value((optional<pbrt::Token> *)&params);
          t_00 = (ParsedParameterVector *)(pTVar12->token)._M_str;
          __x_25._M_len = (pTVar12->token)._M_len;
          __x_25._M_str = (pTVar12->token)._M_str;
          __y_25._M_str = "[";
          __y_25._M_len = 1;
          bVar10 = std::operator!=(__x_25,__y_25);
          pstd::optional<pbrt::Token>::~optional((optional<pbrt::Token> *)&params);
          if (bVar10) goto switchD_00287faa_caseD_42;
          for (lVar11 = 0; lVar11 != 0x10; lVar11 = lVar11 + 1) {
            std::function<pstd::optional<pbrt::Token>_(int)>::operator()
                      ((optional<pbrt::Token> *)&t_1,
                       (function<pstd::optional<pbrt::Token>_(int)> *)&local_3f8,1);
            pTVar12 = pstd::optional<pbrt::Token>::value((optional<pbrt::Token> *)&t_1);
            dVar17 = parseNumber(pTVar12);
            *(float *)((long)&params.alloc.memoryResource + lVar11 * 4) = (float)dVar17;
            pstd::optional<pbrt::Token>::~optional((optional<pbrt::Token> *)&t_1);
          }
          std::function<pstd::optional<pbrt::Token>_(int)>::operator()
                    ((optional<pbrt::Token> *)&t_1,
                     (function<pstd::optional<pbrt::Token>_(int)> *)&local_3f8,1);
          pTVar12 = pstd::optional<pbrt::Token>::value((optional<pbrt::Token> *)&t_1);
          t_00 = (ParsedParameterVector *)(pTVar12->token)._M_str;
          __x_38._M_len = (pTVar12->token)._M_len;
          __x_38._M_str = (pTVar12->token)._M_str;
          __y_38._M_str = "]";
          __y_38._M_len = 1;
          bVar10 = std::operator!=(__x_38,__y_38);
          pstd::optional<pbrt::Token>::~optional((optional<pbrt::Token> *)&t_1);
          pSVar16 = scene_local;
          if (bVar10) goto LAB_002898f3;
          pTVar12 = pstd::optional<pbrt::Token>::value(&tok);
          sVar19 = (pTVar12->loc).filename;
          in_stack_fffffffffffffa48 = (int)sVar19._M_len;
          in_stack_fffffffffffffa4c = sVar19._M_len._4_4_;
          (*pSVar16->_vptr_SceneRepresentation[10])(pSVar16,&params);
        }
        else {
          pTVar12 = pstd::optional<pbrt::Token>::value(&tok);
          __x_32._M_len = (pTVar12->token)._M_len;
          __x_32._M_str = (pTVar12->token)._M_str;
          __y_32._M_str = "Translate";
          __y_32._M_len = 9;
          bVar10 = std::operator==(__x_32,__y_32);
          if (bVar10) {
            for (lVar11 = 0; pcVar14 = t_1.token._M_str, sVar4 = t_1.token._M_len,
                pSVar16 = scene_local, lVar11 != 3; lVar11 = lVar11 + 1) {
              std::function<pstd::optional<pbrt::Token>_(int)>::operator()
                        ((optional<pbrt::Token> *)&params,
                         (function<pstd::optional<pbrt::Token>_(int)> *)&local_3f8,1);
              pTVar12 = pstd::optional<pbrt::Token>::value((optional<pbrt::Token> *)&params);
              dVar17 = parseNumber(pTVar12);
              *(float *)((long)&t_1.token._M_len + lVar11 * 4) = (float)dVar17;
              pstd::optional<pbrt::Token>::~optional((optional<pbrt::Token> *)&params);
            }
            uVar6 = t_1.token._M_len >> 0x20;
            pTVar12 = pstd::optional<pbrt::Token>::value(&tok);
            sVar5 = (pTVar12->loc).filename._M_len;
            in_stack_fffffffffffffa48 = (int)sVar5;
            in_stack_fffffffffffffa4c = (undefined4)(sVar5 >> 0x20);
            (*pSVar16->_vptr_SceneRepresentation[6])
                      (sVar4 & 0xffffffff,uVar6,(ulong)pcVar14 & 0xffffffff,pSVar16);
          }
          else {
            pTVar12 = pstd::optional<pbrt::Token>::value(&tok);
            __x_39._M_len = (pTVar12->token)._M_len;
            __x_39._M_str = (pTVar12->token)._M_str;
            __y_39._M_str = "TransformTimes";
            __y_39._M_len = 0xe;
            bVar10 = std::operator==(__x_39,__y_39);
            if (bVar10) {
              for (lVar11 = 0; sVar4 = t_1.token._M_len, pSVar16 = scene_local, lVar11 != 2;
                  lVar11 = lVar11 + 1) {
                std::function<pstd::optional<pbrt::Token>_(int)>::operator()
                          ((optional<pbrt::Token> *)&params,
                           (function<pstd::optional<pbrt::Token>_(int)> *)&local_3f8,1);
                pTVar12 = pstd::optional<pbrt::Token>::value((optional<pbrt::Token> *)&params);
                dVar17 = parseNumber(pTVar12);
                *(float *)((long)&t_1.token._M_len + lVar11 * 4) = (float)dVar17;
                pstd::optional<pbrt::Token>::~optional((optional<pbrt::Token> *)&params);
              }
              uVar6 = t_1.token._M_len >> 0x20;
              pTVar12 = pstd::optional<pbrt::Token>::value(&tok);
              sVar5 = (pTVar12->loc).filename._M_len;
              in_stack_fffffffffffffa48 = (int)sVar5;
              in_stack_fffffffffffffa4c = (undefined4)(sVar5 >> 0x20);
              (*pSVar16->_vptr_SceneRepresentation[0x10])(sVar4 & 0xffffffff,uVar6,pSVar16);
            }
            else {
              pTVar12 = pstd::optional<pbrt::Token>::value(&tok);
              t_00 = (ParsedParameterVector *)(pTVar12->token)._M_str;
              __x_42._M_len = (pTVar12->token)._M_len;
              __x_42._M_str = (pTVar12->token)._M_str;
              __y_42._M_str = "Texture";
              __y_42._M_len = 7;
              pcVar14 = "Texture";
              bVar10 = std::operator==(__x_42,__y_42);
              if (!bVar10) goto switchD_00287faa_caseD_42;
              std::function<pstd::optional<pbrt::Token>_(int)>::operator()
                        ((optional<pbrt::Token> *)&params,
                         (function<pstd::optional<pbrt::Token>_(int)> *)&local_3f8,1);
              pTVar12 = pstd::optional<pbrt::Token>::value((optional<pbrt::Token> *)&params);
              sVar18 = dequoteString(pTVar12);
              sVar19._M_len = sVar18._M_str;
              pstd::optional<pbrt::Token>::~optional((optional<pbrt::Token> *)&params);
              sVar19._M_str = pcVar14;
              toString_abi_cxx11_(&name,(pbrt *)sVar18._M_len,sVar19);
              std::function<pstd::optional<pbrt::Token>_(int)>::operator()
                        ((optional<pbrt::Token> *)&params,
                         (function<pstd::optional<pbrt::Token>_(int)> *)&local_3f8,1);
              pTVar12 = pstd::optional<pbrt::Token>::value((optional<pbrt::Token> *)&params);
              sVar19 = dequoteString(pTVar12);
              sVar18._M_len = sVar19._M_str;
              pstd::optional<pbrt::Token>::~optional((optional<pbrt::Token> *)&params);
              sVar18._M_str = pcVar14;
              toString_abi_cxx11_(&type,(pbrt *)sVar19._M_len,sVar18);
              std::function<pstd::optional<pbrt::Token>_(int)>::operator()
                        ((optional<pbrt::Token> *)&params,
                         (function<pstd::optional<pbrt::Token>_(int)> *)&local_3f8,1);
              pTVar12 = pstd::optional<pbrt::Token>::value((optional<pbrt::Token> *)&params);
              pcVar14 = *(char **)&(pTVar12->loc).line;
              t_1.token._M_len = (pTVar12->token)._M_len;
              t_1.token._M_str = (pTVar12->token)._M_str;
              t_1.loc.filename._M_len = (pTVar12->loc).filename._M_len;
              t_1.loc.filename._M_str = (pTVar12->loc).filename._M_str;
              t_1.loc._16_8_ = pcVar14;
              pstd::optional<pbrt::Token>::~optional((optional<pbrt::Token> *)&params);
              sVar19 = dequoteString(&t_1);
              s_10._M_len = sVar19._M_str;
              s_10._M_str = pcVar14;
              toString_abi_cxx11_(&texName,(pbrt *)sVar19._M_len,s_10);
              std::function<pstd::optional<pbrt::Token>_(int)>::function
                        (&local_2f0,(function<pstd::optional<pbrt::Token>_(int)> *)&local_3f8);
              local_458._8_8_ = 0;
              alloc_00.memoryResource._1_7_ = 0;
              alloc_00.memoryResource._0_1_ = formatting;
              local_458._M_unused._M_object = &parseError;
              local_440 = std::
                          _Function_handler<void_(const_pbrt::Token_&,_const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/parser.cpp:838:21)>
                          ::_M_invoke;
              local_448 = std::
                          _Function_handler<void_(const_pbrt::Token_&,_const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/parser.cpp:838:21)>
                          ::_M_manager;
              parseParameters<std::function<pstd::optional<pbrt::Token>(int)>,pbrt::parse(pbrt::SceneRepresentation*,std::unique_ptr<pbrt::Tokenizer,std::default_delete<pbrt::Tokenizer>>)::__5>
                        (&params,(pbrt *)&local_2f0,
                         (function<pstd::optional<pbrt::Token>_(int)> *)unget.ungetToken,
                         (anon_class_8_1_6da50f9a)alloc.memoryResource,alloc_00,SUB81(&local_458,0),
                         (function<void_(const_pbrt::Token_&,_const_char_*)> *)
                         CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48));
              std::_Function_base::~_Function_base((_Function_base *)&local_458);
              std::_Function_base::~_Function_base(&local_2f0.super__Function_base);
              pSVar16 = scene_local;
              InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
              ::InlinedVector(&local_2b8,&params);
              pTVar12 = pstd::optional<pbrt::Token>::value(&tok);
              p_Var2 = pSVar16->_vptr_SceneRepresentation[0x20];
              uVar3._0_4_ = (pTVar12->loc).line;
              uVar3._4_4_ = (pTVar12->loc).column;
              sVar4 = (pTVar12->loc).filename._M_len;
              in_stack_fffffffffffffa48 = (int)sVar4;
              in_stack_fffffffffffffa4c = (undefined4)(sVar4 >> 0x20);
              (*p_Var2)(pSVar16,&name,&type,&texName,&local_2b8,p_Var2,in_stack_fffffffffffffa48,
                        (pTVar12->loc).filename._M_str,uVar3);
              InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
              ::~InlinedVector(&local_2b8);
              InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
              ::~InlinedVector(&params);
              std::__cxx11::string::~string((string *)&texName);
              std::__cxx11::string::~string((string *)&type);
              std::__cxx11::string::~string((string *)&name);
            }
          }
        }
        goto LAB_00287f52;
      }
      pTVar12 = pstd::optional<pbrt::Token>::value(&tok);
      lVar11 = 0xf8;
      psVar15 = local_258;
    }
LAB_00288c93:
    psVar15[2] = *(size_t *)&(pTVar12->loc).line;
    pcVar14 = (pTVar12->loc).filename._M_str;
    *psVar15 = (pTVar12->loc).filename._M_len;
    psVar15[1] = (size_t)pcVar14;
    sVar4 = (pTVar12->loc).filename._M_len;
    in_stack_fffffffffffffa48 = (int)sVar4;
    in_stack_fffffffffffffa4c = (undefined4)(sVar4 >> 0x20);
    (**(code **)((long)pSVar16->_vptr_SceneRepresentation + lVar11))(pSVar16);
    goto LAB_00287f52;
  case 'W':
    pTVar12 = pstd::optional<pbrt::Token>::value(&tok);
    __x_02._M_len = (pTVar12->token)._M_len;
    __x_02._M_str = (pTVar12->token)._M_str;
    __y_02._M_str = "WorldBegin";
    __y_02._M_len = 10;
    bVar10 = std::operator==(__x_02,__y_02);
    pSVar16 = scene_local;
    if (bVar10) {
      pTVar12 = pstd::optional<pbrt::Token>::value(&tok);
      lVar11 = 0xd0;
      psVar15 = local_2d0;
      goto LAB_00288c93;
    }
    pTVar12 = pstd::optional<pbrt::Token>::value(&tok);
    t_00 = (ParsedParameterVector *)(pTVar12->token)._M_str;
    __x_15._M_len = (pTVar12->token)._M_len;
    __x_15._M_str = (pTVar12->token)._M_str;
    __y_15._M_str = "WorldEnd";
    __y_15._M_len = 8;
    bVar10 = std::operator==(__x_15,__y_15);
    if ((!bVar10) || (formatting == false)) goto switchD_00287faa_caseD_42;
    goto LAB_00287f52;
  }
  psVar15[2] = *(size_t *)&(pTVar12->loc).line;
  pcVar14 = (pTVar12->loc).filename._M_str;
  *psVar15 = (pTVar12->loc).filename._M_len;
  psVar15[1] = (size_t)pcVar14;
  sVar19 = (pTVar12->loc).filename;
  in_stack_fffffffffffffa48 = (int)sVar19._M_len;
  in_stack_fffffffffffffa4c = sVar19._M_len._4_4_;
  parse::anon_class_48_6_0442aee5::operator()(&basicParamListEntrypoint,apiFunc,pTVar12->loc);
  goto LAB_00287f52;
}

Assistant:

static void parse(SceneRepresentation *scene, std::unique_ptr<Tokenizer> t) {
    bool formatting = dynamic_cast<FormattingScene *>(scene) != nullptr;
    TrackedMemoryResource memoryResource;
    Allocator alloc(&memoryResource);

    std::vector<std::unique_ptr<Tokenizer>> fileStack;
    fileStack.push_back(std::move(t));

    pstd::optional<Token> ungetToken;

    auto parseError = [&](const char *msg, const FileLoc *loc) {
        ErrorExit(loc, "%s", msg);
    };

    // nextToken is a little helper function that handles the file stack,
    // returning the next token from the current file until reaching EOF,
    // at which point it switches to the next file (if any).
    std::function<pstd::optional<Token>(int)> nextToken;
    nextToken = [&](int flags) -> pstd::optional<Token> {
        if (ungetToken.has_value())
            return std::exchange(ungetToken, {});

        if (fileStack.empty()) {
            if ((flags & TokenRequired) != 0) {
                ErrorExit("premature end of file");
            }
            return {};
        }

        pstd::optional<Token> tok = fileStack.back()->Next();

        if (!tok) {
            // We've reached EOF in the current file. Anything more to parse?
            fileStack.pop_back();
            return nextToken(flags);
        } else if (tok->token[0] == '#') {
            // Swallow comments, unless --format or --toply was given, in
            // which case they're printed to stdout.
            if (formatting)
                printf("%s%s\n", dynamic_cast<FormattingScene *>(scene)->indent().c_str(),
                       toString(tok->token).c_str());
            return nextToken(flags);
        } else
            // Regular token; success.
            return tok;
    };

    auto unget = [&](Token t) {
        CHECK(!ungetToken.has_value());
        ungetToken = t;
    };

    // Helper function for pbrt API entrypoints that take a single string
    // parameter and a ParameterVector (e.g. pbrtShape()).
    // using BasicEntrypoint = void (ParsedScene::*)(const std::string &,
    // ParsedParameterVector, FileLoc);
    auto basicParamListEntrypoint = [&](void (SceneRepresentation::*apiFunc)(
                                            const std::string &, ParsedParameterVector,
                                            FileLoc),
                                        FileLoc loc) {
        Token t = *nextToken(TokenRequired);
        std::string_view dequoted = dequoteString(t);
        std::string n = toString(dequoted);
        ParsedParameterVector parameterVector = parseParameters(
            nextToken, unget, alloc, formatting, [&](const Token &t, const char *msg) {
                std::string token = toString(t.token);
                std::string str = StringPrintf("%s: %s", token, msg);
                parseError(str.c_str(), &t.loc);
            });
        (scene->*apiFunc)(n, std::move(parameterVector), loc);
    };

    auto syntaxError = [&](const Token &t) {
        ErrorExit(&t.loc, "Unknown directive: %s", toString(t.token));
    };

    pstd::optional<Token> tok;
    CheckCallbackScope _([&tok]() -> std::string {
        if (!tok.has_value())
            return "";
        std::string filename(tok->loc.filename.begin(), tok->loc.filename.end());
        return StringPrintf("Current parser location %s:%d:%d", filename, tok->loc.line,
                            tok->loc.column);
    });

    while (true) {
        tok = nextToken(TokenOptional);
        if (!tok.has_value())
            break;

        switch (tok->token[0]) {
        case 'A':
            if (tok->token == "AttributeBegin")
                scene->AttributeBegin(tok->loc);
            else if (tok->token == "AttributeEnd")
                scene->AttributeEnd(tok->loc);
            else if (tok->token == "Attribute")
                basicParamListEntrypoint(&SceneRepresentation::Attribute, tok->loc);
            else if (tok->token == "ActiveTransform") {
                Token a = *nextToken(TokenRequired);
                if (a.token == "All")
                    scene->ActiveTransformAll(tok->loc);
                else if (a.token == "EndTime")
                    scene->ActiveTransformEndTime(tok->loc);
                else if (a.token == "StartTime")
                    scene->ActiveTransformStartTime(tok->loc);
                else
                    syntaxError(*tok);
            } else if (tok->token == "AreaLightSource")
                basicParamListEntrypoint(&SceneRepresentation::AreaLightSource, tok->loc);
            else if (tok->token == "Accelerator")
                basicParamListEntrypoint(&SceneRepresentation::Accelerator, tok->loc);
            else
                syntaxError(*tok);
            break;

        case 'C':
            if (tok->token == "ConcatTransform") {
                if (nextToken(TokenRequired)->token != "[")
                    syntaxError(*tok);
                Float m[16];
                for (int i = 0; i < 16; ++i)
                    m[i] = parseNumber(*nextToken(TokenRequired));
                if (nextToken(TokenRequired)->token != "]")
                    syntaxError(*tok);
                scene->ConcatTransform(m, tok->loc);
            } else if (tok->token == "CoordinateSystem") {
                std::string_view n = dequoteString(*nextToken(TokenRequired));
                scene->CoordinateSystem(toString(n), tok->loc);
            } else if (tok->token == "CoordSysTransform") {
                std::string_view n = dequoteString(*nextToken(TokenRequired));
                scene->CoordSysTransform(toString(n), tok->loc);
            } else if (tok->token == "ColorSpace") {
                std::string_view n = dequoteString(*nextToken(TokenRequired));
                scene->ColorSpace(toString(n), tok->loc);
            } else if (tok->token == "Camera")
                basicParamListEntrypoint(&SceneRepresentation::Camera, tok->loc);
            else
                syntaxError(*tok);
            break;

        case 'F':
            if (tok->token == "Film")
                basicParamListEntrypoint(&SceneRepresentation::Film, tok->loc);
            else
                syntaxError(*tok);
            break;

        case 'I':
            if (tok->token == "Integrator")
                basicParamListEntrypoint(&SceneRepresentation::Integrator, tok->loc);
            else if (tok->token == "Include") {
                Token filenameToken = *nextToken(TokenRequired);
                std::string filename = toString(dequoteString(filenameToken));
                if (formatting)
                    Printf("%sInclude \"%s\"\n",
                           dynamic_cast<FormattingScene *>(scene)->indent(), filename);
                else {
                    filename = ResolveFilename(filename);
                    std::unique_ptr<Tokenizer> tinc =
                        Tokenizer::CreateFromFile(filename, parseError);
                    if (tinc)
                        fileStack.push_back(std::move(tinc));
                }
            } else if (tok->token == "Identity")
                scene->Identity(tok->loc);
            else
                syntaxError(*tok);
            break;

        case 'L':
            if (tok->token == "LightSource")
                basicParamListEntrypoint(&SceneRepresentation::LightSource, tok->loc);
            else if (tok->token == "LookAt") {
                Float v[9];
                for (int i = 0; i < 9; ++i)
                    v[i] = parseNumber(*nextToken(TokenRequired));
                scene->LookAt(v[0], v[1], v[2], v[3], v[4], v[5], v[6], v[7], v[8],
                              tok->loc);
            } else
                syntaxError(*tok);
            break;

        case 'M':
            if (tok->token == "MakeNamedMaterial")
                basicParamListEntrypoint(&SceneRepresentation::MakeNamedMaterial,
                                         tok->loc);
            else if (tok->token == "MakeNamedMedium")
                basicParamListEntrypoint(&SceneRepresentation::MakeNamedMedium, tok->loc);
            else if (tok->token == "Material")
                basicParamListEntrypoint(&SceneRepresentation::Material, tok->loc);
            else if (tok->token == "MediumInterface") {
                std::string_view n = dequoteString(*nextToken(TokenRequired));
                std::string names[2];
                names[0] = toString(n);

                // Check for optional second parameter
                pstd::optional<Token> second = nextToken(TokenOptional);
                if (second.has_value()) {
                    if (isQuotedString(second->token))
                        names[1] = toString(dequoteString(*second));
                    else {
                        unget(*second);
                        names[1] = names[0];
                    }
                } else
                    names[1] = names[0];

                scene->MediumInterface(names[0], names[1], tok->loc);
            } else
                syntaxError(*tok);
            break;

        case 'N':
            if (tok->token == "NamedMaterial") {
                std::string_view n = dequoteString(*nextToken(TokenRequired));
                scene->NamedMaterial(toString(n), tok->loc);
            } else
                syntaxError(*tok);
            break;

        case 'O':
            if (tok->token == "ObjectBegin") {
                std::string_view n = dequoteString(*nextToken(TokenRequired));
                scene->ObjectBegin(toString(n), tok->loc);
            } else if (tok->token == "ObjectEnd")
                scene->ObjectEnd(tok->loc);
            else if (tok->token == "ObjectInstance") {
                std::string_view n = dequoteString(*nextToken(TokenRequired));
                scene->ObjectInstance(toString(n), tok->loc);
            } else if (tok->token == "Option") {
                std::string name = toString(dequoteString(*nextToken(TokenRequired)));
                std::string value = toString(nextToken(TokenRequired)->token);
                scene->Option(name, value, tok->loc);
            } else
                syntaxError(*tok);
            break;

        case 'P':
            if (tok->token == "PixelFilter")
                basicParamListEntrypoint(&SceneRepresentation::PixelFilter, tok->loc);
            else
                syntaxError(*tok);
            break;

        case 'R':
            if (tok->token == "ReverseOrientation")
                scene->ReverseOrientation(tok->loc);
            else if (tok->token == "Rotate") {
                Float v[4];
                for (int i = 0; i < 4; ++i)
                    v[i] = parseNumber(*nextToken(TokenRequired));
                scene->Rotate(v[0], v[1], v[2], v[3], tok->loc);
            } else
                syntaxError(*tok);
            break;

        case 'S':
            if (tok->token == "Shape")
                basicParamListEntrypoint(&SceneRepresentation::Shape, tok->loc);
            else if (tok->token == "Sampler")
                basicParamListEntrypoint(&SceneRepresentation::Sampler, tok->loc);
            else if (tok->token == "Scale") {
                Float v[3];
                for (int i = 0; i < 3; ++i)
                    v[i] = parseNumber(*nextToken(TokenRequired));
                scene->Scale(v[0], v[1], v[2], tok->loc);
            } else
                syntaxError(*tok);
            break;

        case 'T':
            if (tok->token == "TransformBegin")
                scene->TransformBegin(tok->loc);
            else if (tok->token == "TransformEnd")
                scene->TransformEnd(tok->loc);
            else if (tok->token == "Transform") {
                if (nextToken(TokenRequired)->token != "[")
                    syntaxError(*tok);
                Float m[16];
                for (int i = 0; i < 16; ++i)
                    m[i] = parseNumber(*nextToken(TokenRequired));
                if (nextToken(TokenRequired)->token != "]")
                    syntaxError(*tok);
                scene->Transform(m, tok->loc);
            } else if (tok->token == "Translate") {
                Float v[3];
                for (int i = 0; i < 3; ++i)
                    v[i] = parseNumber(*nextToken(TokenRequired));
                scene->Translate(v[0], v[1], v[2], tok->loc);
            } else if (tok->token == "TransformTimes") {
                Float v[2];
                for (int i = 0; i < 2; ++i)
                    v[i] = parseNumber(*nextToken(TokenRequired));
                scene->TransformTimes(v[0], v[1], tok->loc);
            } else if (tok->token == "Texture") {
                std::string_view n = dequoteString(*nextToken(TokenRequired));
                std::string name = toString(n);
                n = dequoteString(*nextToken(TokenRequired));
                std::string type = toString(n);

                Token t = *nextToken(TokenRequired);
                std::string_view dequoted = dequoteString(t);
                std::string texName = toString(dequoted);
                ParsedParameterVector params = parseParameters(
                    nextToken, unget, alloc, formatting,
                    [&](const Token &t, const char *msg) {
                        std::string token = toString(t.token);
                        std::string str = StringPrintf("%s: %s", token, msg);
                        parseError(str.c_str(), &t.loc);
                    });

                scene->Texture(name, type, texName, std::move(params), tok->loc);
            } else
                syntaxError(*tok);
            break;

        case 'W':
            if (tok->token == "WorldBegin")
                scene->WorldBegin(tok->loc);
            else if (tok->token == "WorldEnd" && formatting)
                ;  // just swallow it
            else
                syntaxError(*tok);
            break;

        default:
            syntaxError(*tok);
        }
    }
}